

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

int __thiscall
axl::sl::
ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
::remove(ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
         *this,char *__filename)

{
  size_t *psVar1;
  ListLink *pLVar2;
  ViewEntry *pVVar3;
  ListLink *link;
  ListLink *pLVar4;
  
  pVVar3 = *(ViewEntry **)__filename;
  pLVar2 = *(ListLink **)(__filename + 8);
  pLVar4 = pLVar2;
  if (pLVar2 == (ListLink *)0x0) {
    pLVar4 = (ListLink *)this;
  }
  ((ListData<axl::io::MappedViewMgr::ViewEntry> *)&pLVar4->m_next)->m_head = pVVar3;
  if (pVVar3 == (ViewEntry *)0x0) {
    pVVar3 = (ViewEntry *)this;
  }
  (pVVar3->super_ListLink).m_prev = pLVar2;
  psVar1 = &(this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_count;
  *psVar1 = *psVar1 - 1;
  return (int)__filename;
}

Assistant:

T*
	remove(Iterator it) {
		ASSERT(!isEmpty());

		ListLink* link = it.getLink();
		ListLink* next = link->m_next;
		ListLink* prev = link->m_prev;

		if (prev)
			prev->m_next = next;
		else
			this->m_head = Iterator::getEntryFromLink(next);

		if (next)
			next->m_prev = prev;
		else
			this->m_tail = Iterator::getEntryFromLink(prev);

		this->m_count--;
		return it.getEntry();
	}